

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raii_event_tests.cpp
# Opt level: O1

void __thiscall raii_event_tests::raii_event_order::test_method(raii_event_order *this)

{
  ushort uVar1;
  mapped_type_conflict2 *pmVar2;
  runtime_error *this_00;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  raii_event event;
  raii_event_base base;
  void *event_ptr;
  void *base_ptr;
  check_type cVar5;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  lazy_ostream local_b0;
  undefined1 *local_a0;
  char **local_98;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  __uniq_ptr_impl<event,_event_deleter> local_58;
  unique_ptr<event_base,_event_base_deleter> local_50;
  __uniq_ptr_impl<event,_event_deleter> local_48;
  _Head_base<0UL,_event_base_*,_false> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  event_set_mem_functions(tag_malloc,realloc,tag_free);
  local_40._M_head_impl = (event_base *)0x0;
  local_48._M_t.super__Tuple_impl<0UL,_event_*,_event_deleter>.super__Head_base<0UL,_event_*,_false>
  ._M_head_impl = (tuple<event_*,_event_deleter>)(_Tuple_impl<0UL,_event_*,_event_deleter>)0x0;
  local_50._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
  super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
  super__Head_base<0UL,_event_base_*,_false>._M_head_impl =
       (__uniq_ptr_data<event_base,_event_base_deleter,_true,_true>)event_base_new();
  if ((tuple<event_base_*,_event_base_deleter>)
      local_50._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
      super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
      super__Head_base<0UL,_event_base_*,_false>._M_head_impl ==
      (_Head_base<0UL,_event_base_*,_false>)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"cannot create event_base");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pvVar3 = (iterator)0x0;
    local_58._M_t.super__Tuple_impl<0UL,_event_*,_event_deleter>.
    super__Head_base<0UL,_event_*,_false>._M_head_impl =
         (tuple<event_*,_event_deleter>)
         event_new(local_50._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
                   super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
                   super__Head_base<0UL,_event_base_*,_false>._M_head_impl,0xffffffff,0,0);
    local_40._M_head_impl =
         (event_base *)
         local_50._M_t.super___uniq_ptr_impl<event_base,_event_base_deleter>._M_t.
         super__Tuple_impl<0UL,_event_base_*,_event_base_deleter>.
         super__Head_base<0UL,_event_base_*,_false>._M_head_impl;
    local_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
    ;
    local_60 = "";
    local_78 = &boost::unit_test::basic_cstring<char_const>::null;
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x51;
    file.m_begin = (iterator)&local_68;
    msg.m_end = in_R9;
    msg.m_begin = pvVar3;
    local_48._M_t.super__Tuple_impl<0UL,_event_*,_event_deleter>.
    super__Head_base<0UL,_event_*,_false>._M_head_impl =
         local_58._M_t.super__Tuple_impl<0UL,_event_*,_event_deleter>.
         super__Head_base<0UL,_event_*,_false>._M_head_impl;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
    pmVar2 = std::
             map<void_*,_unsigned_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_short>_>_>
             ::operator[]((map<void_*,_unsigned_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_short>_>_>
                           *)orders,&local_40._M_head_impl);
    uVar1 = *pmVar2;
    pmVar2 = std::
             map<void_*,_unsigned_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_short>_>_>
             ::operator[]((map<void_*,_unsigned_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_short>_>_>
                           *)orders,(key_type *)&local_48);
    local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(uVar1 < *pmVar2);
    local_90.m_message.px = (element_type *)0x0;
    local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c0 = "orders[base_ptr] < orders[event_ptr]";
    local_b8 = "";
    local_b0.m_empty = false;
    local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_a0 = boost::unit_test::lazy_ostream::inst;
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
    ;
    local_c8 = "";
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x0;
    local_98 = &local_c0;
    boost::test_tools::tt_detail::report_assertion
              (&local_90,&local_b0,1,0,WARN,_cVar5,(size_t)&local_d0,0x51);
    boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
    std::unique_ptr<event,_event_deleter>::~unique_ptr
              ((unique_ptr<event,_event_deleter> *)&local_58);
    std::unique_ptr<event_base,_event_base_deleter>::~unique_ptr(&local_50);
    local_e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/raii_event_tests.cpp"
    ;
    local_d8 = "";
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x54;
    file_00.m_begin = (iterator)&local_e0;
    msg_00.m_end = pvVar4;
    msg_00.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f0,
               msg_00);
    pmVar2 = std::
             map<void_*,_unsigned_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_short>_>_>
             ::operator[]((map<void_*,_unsigned_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_short>_>_>
                           *)orders,&local_40._M_head_impl);
    uVar1 = *pmVar2;
    pmVar2 = std::
             map<void_*,_unsigned_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_short>_>_>
             ::operator[]((map<void_*,_unsigned_short,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_short>_>_>
                           *)orders,(key_type *)&local_48);
    local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(*pmVar2 < uVar1);
    local_90.m_message.px = (element_type *)0x0;
    local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c0 = "orders[base_ptr] > orders[event_ptr]";
    local_b8 = "";
    local_b0.m_empty = false;
    local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
    local_a0 = boost::unit_test::lazy_ostream::inst;
    local_98 = &local_c0;
    boost::test_tools::tt_detail::report_assertion
              (&local_90,&local_b0,1,0,WARN,0xee7223,(size_t)&stack0xffffffffffffff00,0x54);
    boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
    event_set_mem_functions(malloc,realloc,free);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(raii_event_order)
{
    event_set_mem_functions(tag_malloc, realloc, tag_free);

    void* base_ptr = nullptr;
    void* event_ptr = nullptr;
    {
        auto base = obtain_event_base();
        auto event = obtain_event(base.get(), -1, 0, nullptr, nullptr);

        base_ptr = (void*)base.get();
        event_ptr = (void*)event.get();

        // base should have allocated before event
        BOOST_CHECK(orders[base_ptr] < orders[event_ptr]);
    }
    // base should be freed after event
    BOOST_CHECK(orders[base_ptr] > orders[event_ptr]);

    event_set_mem_functions(malloc, realloc, free);
}